

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O0

void ncnn::innerproduct_fp16s_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  undefined8 *puVar68;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  float fVar69;
  float fVar71;
  float fVar72;
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  float *outptr;
  __m128 _w;
  __m128 _val;
  __m256 _w23_1;
  __m256 _w01_1;
  __m256i _w0123_1;
  __m256 _val23_1;
  __m256 _val01_1;
  __m128 _val3_1;
  __m128 _val2_1;
  __m128 _val1_1;
  __m128 _val0_1;
  __m256 _w67;
  __m256 _w45;
  __m256 _w23;
  __m256 _w01;
  __m256i _w4567;
  __m256i _w0123;
  __m256 _val67;
  __m256 _val45;
  __m256 _val23;
  __m256 _val01;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int i;
  float *sptr;
  unsigned_short *kptr;
  __m256 _sum67;
  __m256 _sum45;
  __m256 _sum23;
  __m256 _sum01;
  __m128 _sum0;
  int p;
  float *bias_data_ptr;
  int num_output;
  int num_input;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_2b54;
  long local_2b50;
  undefined1 (*local_2b48) [32];
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  float fStack_2b24;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  float fStack_2ae4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined8 local_2ab0;
  undefined8 uStack_2aa8;
  int local_2a94;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_2370;
  float fStack_236c;
  float fStack_2368;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  float local_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined1 local_1fb0 [8];
  undefined8 uStack_1fa8;
  ulong uStack_1f48;
  float local_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  ulong uStack_1cf8;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  undefined8 local_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  ulong uStack_1a48;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float local_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  float local_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float local_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  float local_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_780;
  undefined8 uStack_778;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  
  iVar67 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[3];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  for (local_2a94 = 0; local_2a94 < iVar2; local_2a94 = local_2a94 + 1) {
    fStack_2ad0 = 0.0;
    fStack_2acc = 0.0;
    fStack_2ac8 = 0.0;
    fStack_2ac4 = 0.0;
    fStack_2af0 = 0.0;
    fStack_2aec = 0.0;
    fStack_2ae8 = 0.0;
    fStack_2ae4 = 0.0;
    fStack_2b10 = 0.0;
    fStack_2b0c = 0.0;
    fStack_2b08 = 0.0;
    fStack_2b04 = 0.0;
    fStack_2b30 = 0.0;
    fStack_2b2c = 0.0;
    fStack_2b28 = 0.0;
    fStack_2b24 = 0.0;
    local_2b48 = (undefined1 (*) [32])
                 (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_2a94 * in_RDX[2]);
    local_2b50 = *in_RDI;
    for (local_2b54 = 0; local_2b54 + 7 < iVar67; local_2b54 = local_2b54 + 8) {
      fVar69 = *(float *)(local_2b50 + 4);
      fVar71 = *(float *)(local_2b50 + 0xc);
      fVar72 = *(float *)(local_2b50 + 0x14);
      fVar73 = *(float *)(local_2b50 + 0x1c);
      auVar4 = vlddqu_avx(*local_2b48);
      auVar5 = vlddqu_avx(local_2b48[1]);
      auVar9 = vcvtph2ps_f16c(auVar4._0_16_);
      auVar4 = vcvtph2ps_f16c(auVar4._16_16_);
      auVar10 = vcvtph2ps_f16c(auVar5._0_16_);
      auVar5 = vcvtph2ps_f16c(auVar5._16_16_);
      fStack_2470 = auVar9._16_4_;
      fStack_246c = auVar9._20_4_;
      fStack_2468 = auVar9._24_4_;
      fStack_2ad0 = fVar69 * fStack_2470 + fStack_2ad0;
      fStack_2acc = fVar69 * fStack_246c + fStack_2acc;
      fStack_2ac8 = fVar69 * fStack_2468 + fStack_2ac8;
      fStack_2ac4 = fVar69 + fStack_2ac4;
      fStack_2430 = auVar4._16_4_;
      fStack_242c = auVar4._20_4_;
      fStack_2428 = auVar4._24_4_;
      fStack_2af0 = fVar71 * fStack_2430 + fStack_2af0;
      fStack_2aec = fVar71 * fStack_242c + fStack_2aec;
      fStack_2ae8 = fVar71 * fStack_2428 + fStack_2ae8;
      fStack_2ae4 = fVar71 + fStack_2ae4;
      fStack_23f0 = auVar10._16_4_;
      fStack_23ec = auVar10._20_4_;
      fStack_23e8 = auVar10._24_4_;
      fStack_2b10 = fVar72 * fStack_23f0 + fStack_2b10;
      fStack_2b0c = fVar72 * fStack_23ec + fStack_2b0c;
      fStack_2b08 = fVar72 * fStack_23e8 + fStack_2b08;
      fStack_2b04 = fVar72 + fStack_2b04;
      fStack_23b0 = auVar5._16_4_;
      fStack_23ac = auVar5._20_4_;
      fStack_23a8 = auVar5._24_4_;
      fStack_2b30 = fVar73 * fStack_23b0 + fStack_2b30;
      fStack_2b2c = fVar73 * fStack_23ac + fStack_2b2c;
      fStack_2b28 = fVar73 * fStack_23a8 + fStack_2b28;
      fStack_2b24 = fVar73 + fStack_2b24;
      local_2b50 = local_2b50 + 0x20;
      local_2b48 = local_2b48 + 2;
    }
    for (; local_2b54 + 3 < iVar67; local_2b54 = local_2b54 + 4) {
      fVar69 = *(float *)(local_2b50 + 4);
      fVar71 = *(float *)(local_2b50 + 0xc);
      auVar4 = vlddqu_avx(*local_2b48);
      auVar5 = vcvtph2ps_f16c(auVar4._0_16_);
      auVar4 = vcvtph2ps_f16c(auVar4._16_16_);
      fStack_2370 = auVar5._16_4_;
      fStack_236c = auVar5._20_4_;
      fStack_2368 = auVar5._24_4_;
      fStack_2ad0 = fVar69 * fStack_2370 + fStack_2ad0;
      fStack_2acc = fVar69 * fStack_236c + fStack_2acc;
      fStack_2ac8 = fVar69 * fStack_2368 + fStack_2ac8;
      fStack_2ac4 = fVar69 + fStack_2ac4;
      fStack_2330 = auVar4._16_4_;
      fStack_232c = auVar4._20_4_;
      fStack_2328 = auVar4._24_4_;
      fStack_2af0 = fVar71 * fStack_2330 + fStack_2af0;
      fStack_2aec = fVar71 * fStack_232c + fStack_2aec;
      fStack_2ae8 = fVar71 * fStack_2328 + fStack_2ae8;
      fStack_2ae4 = fVar71 + fStack_2ae4;
      local_2b50 = local_2b50 + 0x10;
      local_2b48 = local_2b48 + 1;
    }
    for (; local_2b54 < iVar67; local_2b54 = local_2b54 + 1) {
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)*local_2b48;
      vcvtph2ps_f16c(auVar70);
      local_2b48 = (undefined1 (*) [32])(*local_2b48 + 8);
    }
    fVar69 = fStack_2ad0 + fStack_2af0 + fStack_2b10 + fStack_2b30 + local_2050;
    fVar71 = fStack_2acc + fStack_2aec + fStack_2b0c + fStack_2b2c + fStack_204c;
    fVar72 = fStack_2ac8 + fStack_2ae8 + fStack_2b08 + fStack_2b28 + fStack_2048;
    fVar73 = fStack_2ac4 + fStack_2ae4 + fStack_2b04 + fStack_2b24 + fStack_2044;
    local_2ab0 = CONCAT44(fVar71,fVar69);
    uStack_2aa8 = CONCAT44(fVar73,fVar72);
    switch(in_R8D) {
    case 1:
      uStack_1f48 = SUB168(ZEXT816(0),4);
      auVar11._8_8_ = uStack_2aa8;
      auVar11._0_8_ = local_2ab0;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uStack_1f48;
      _local_1fb0 = vmaxps_avx(auVar11,auVar63 << 0x40);
      break;
    case 2:
      fVar69 = *(float *)*in_R9;
      auVar14._8_8_ = uStack_2aa8;
      auVar14._0_8_ = local_2ab0;
      auVar7 = vmaxps_avx(ZEXT816(0),auVar14);
      auVar15._8_8_ = uStack_2aa8;
      auVar15._0_8_ = local_2ab0;
      auVar3 = vminps_avx(ZEXT816(0),auVar15);
      local_1da0 = auVar3._0_4_;
      fStack_1d9c = auVar3._4_4_;
      fStack_1d98 = auVar3._8_4_;
      fStack_1d94 = auVar3._12_4_;
      local_1db0 = auVar7._0_4_;
      fStack_1dac = auVar7._4_4_;
      fStack_1da8 = auVar7._8_4_;
      fStack_1da4 = auVar7._12_4_;
      local_1fb0._4_4_ = fStack_1dac + fVar69 * fStack_1d9c;
      local_1fb0._0_4_ = local_1db0 + fVar69 * local_1da0;
      uStack_1fa8._0_4_ = fStack_1da8 + fVar69 * fStack_1d98;
      uStack_1fa8._4_4_ = fStack_1da4 + fVar69 * fStack_1d94;
      break;
    case 3:
      uVar1 = *(undefined4 *)*in_R9;
      auVar12._4_4_ = uVar1;
      auVar12._0_4_ = uVar1;
      auVar12._12_4_ = uVar1;
      auVar12._8_4_ = uVar1;
      uVar1 = *(undefined4 *)(*in_R9 + 4);
      auVar16._4_4_ = uVar1;
      auVar16._0_4_ = uVar1;
      auVar16._12_4_ = uVar1;
      auVar16._8_4_ = uVar1;
      auVar13._8_8_ = uStack_2aa8;
      auVar13._0_8_ = local_2ab0;
      auVar7 = vmaxps_avx(auVar13,auVar12);
      _local_1fb0 = vminps_avx(auVar7,auVar16);
      break;
    case 4:
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      uStack_1cf8 = SUB168(ZEXT816(0),4);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uStack_1cf8;
      auVar26._8_8_ = uStack_2aa8;
      auVar26._0_8_ = local_2ab0;
      auVar7 = vsubps_avx(auVar64 << 0x40,auVar26);
      auVar25._8_8_ = 0x42b0c0a542b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar25);
      auVar24._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar7,auVar24);
      local_12c0 = auVar6._0_4_;
      fStack_12bc = auVar6._4_4_;
      fStack_12b8 = auVar6._8_4_;
      fStack_12b4 = auVar6._12_4_;
      fVar69 = local_12c0 * 1.442695 + 0.5;
      fVar71 = fStack_12bc * 1.442695 + 0.5;
      fVar72 = fStack_12b8 * 1.442695 + 0.5;
      fVar73 = fStack_12b4 * 1.442695 + 0.5;
      local_1670 = CONCAT44(fVar71,fVar69);
      uStack_1668._0_4_ = fVar72;
      uStack_1668._4_4_ = fVar73;
      local_1680 = CONCAT44((int)fVar71,(int)fVar69);
      uStack_1678._0_4_ = (int)fVar72;
      uStack_1678._4_4_ = (int)fVar73;
      auVar27._8_8_ = uStack_1678;
      auVar27._0_8_ = local_1680;
      auVar3 = vcvtdq2ps_avx(auVar27);
      auVar29._8_8_ = uStack_1668;
      auVar29._0_8_ = local_1670;
      auVar7 = vcmpps_avx(auVar29,auVar3,1);
      auVar31._8_8_ = 0x3f8000003f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar7 = vpand_avx(auVar7,auVar31);
      auVar7 = vsubps_avx(auVar3,auVar7);
      local_1080 = auVar7._0_4_;
      fStack_107c = auVar7._4_4_;
      fStack_1078 = auVar7._8_4_;
      fStack_1074 = auVar7._12_4_;
      auVar34._4_4_ = fStack_107c * 0.6933594;
      auVar34._0_4_ = local_1080 * 0.6933594;
      auVar34._8_4_ = fStack_1078 * 0.6933594;
      auVar34._12_4_ = fStack_1074 * 0.6933594;
      auVar7 = vsubps_avx(auVar6,auVar34);
      auVar33._4_4_ = fStack_107c * -0.00021219444;
      auVar33._0_4_ = local_1080 * -0.00021219444;
      auVar33._8_4_ = fStack_1078 * -0.00021219444;
      auVar33._12_4_ = fStack_1074 * -0.00021219444;
      auVar7 = vsubps_avx(auVar7,auVar33);
      local_12e0 = auVar7._0_4_;
      fStack_12dc = auVar7._4_4_;
      fStack_12d8 = auVar7._8_4_;
      fStack_12d4 = auVar7._12_4_;
      local_1680 = CONCAT44((int)fStack_107c,(int)local_1080);
      uStack_1678._0_4_ = (int)fStack_1078;
      uStack_1678._4_4_ = (int)fStack_1074;
      auVar23._8_8_ = uStack_1678;
      auVar23._0_8_ = local_1680;
      auVar22._8_8_ = 0x7f0000007f;
      auVar22._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar23,auVar22);
      auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_1310 = auVar7._0_4_;
      fStack_130c = auVar7._4_4_;
      fStack_1308 = auVar7._8_4_;
      fStack_1304 = auVar7._12_4_;
      auVar18._4_4_ =
           ((((((fStack_12dc * 0.00019875691 + 0.0013981999) * fStack_12dc + 0.008333452) *
               fStack_12dc + 0.041665796) * fStack_12dc + 0.16666666) * fStack_12dc + 0.5) *
            fStack_12dc * fStack_12dc + fStack_12dc + 1.0) * fStack_130c + 1.0;
      auVar18._0_4_ =
           ((((((local_12e0 * 0.00019875691 + 0.0013981999) * local_12e0 + 0.008333452) * local_12e0
              + 0.041665796) * local_12e0 + 0.16666666) * local_12e0 + 0.5) *
            local_12e0 * local_12e0 + local_12e0 + 1.0) * local_1310 + 1.0;
      auVar18._8_4_ =
           ((((((fStack_12d8 * 0.00019875691 + 0.0013981999) * fStack_12d8 + 0.008333452) *
               fStack_12d8 + 0.041665796) * fStack_12d8 + 0.16666666) * fStack_12d8 + 0.5) *
            fStack_12d8 * fStack_12d8 + fStack_12d8 + 1.0) * fStack_1308 + 1.0;
      auVar18._12_4_ =
           ((((((fStack_12d4 * 0.00019875691 + 0.0013981999) * fStack_12d4 + 0.008333452) *
               fStack_12d4 + 0.041665796) * fStack_12d4 + 0.16666666) * fStack_12d4 + 0.5) *
            fStack_12d4 * fStack_12d4 + fStack_12d4 + 1.0) * fStack_1304 + 1.0;
      _local_1fb0 = vdivps_avx(auVar17,auVar18);
      break;
    case 5:
      uStack_1a48 = SUB168(ZEXT816(0),4);
      auVar21._8_8_ = uStack_2aa8;
      auVar21._0_8_ = local_2ab0;
      auVar20._8_8_ = 0x42b0c0a542b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar21,auVar20);
      auVar19._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar7,auVar19);
      local_1710 = auVar6._0_4_;
      fStack_170c = auVar6._4_4_;
      fStack_1708 = auVar6._8_4_;
      fStack_1704 = auVar6._12_4_;
      fVar74 = local_1710 * 1.442695 + 0.5;
      fVar75 = fStack_170c * 1.442695 + 0.5;
      fVar76 = fStack_1708 * 1.442695 + 0.5;
      fVar77 = fStack_1704 * 1.442695 + 0.5;
      local_1ac0 = CONCAT44(fVar75,fVar74);
      uStack_1ab8._0_4_ = fVar76;
      uStack_1ab8._4_4_ = fVar77;
      local_1ad0 = CONCAT44((int)fVar75,(int)fVar74);
      uStack_1ac8._0_4_ = (int)fVar76;
      uStack_1ac8._4_4_ = (int)fVar77;
      auVar28._8_8_ = uStack_1ac8;
      auVar28._0_8_ = local_1ad0;
      auVar3 = vcvtdq2ps_avx(auVar28);
      auVar30._8_8_ = uStack_1ab8;
      auVar30._0_8_ = local_1ac0;
      auVar7 = vcmpps_avx(auVar30,auVar3,1);
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar7 = vpand_avx(auVar7,auVar32);
      auVar7 = vsubps_avx(auVar3,auVar7);
      local_fa0 = auVar7._0_4_;
      fStack_f9c = auVar7._4_4_;
      fStack_f98 = auVar7._8_4_;
      fStack_f94 = auVar7._12_4_;
      auVar36._4_4_ = fStack_f9c * 0.6933594;
      auVar36._0_4_ = local_fa0 * 0.6933594;
      auVar36._8_4_ = fStack_f98 * 0.6933594;
      auVar36._12_4_ = fStack_f94 * 0.6933594;
      auVar7 = vsubps_avx(auVar6,auVar36);
      auVar35._4_4_ = fStack_f9c * -0.00021219444;
      auVar35._0_4_ = local_fa0 * -0.00021219444;
      auVar35._8_4_ = fStack_f98 * -0.00021219444;
      auVar35._12_4_ = fStack_f94 * -0.00021219444;
      auVar7 = vsubps_avx(auVar7,auVar35);
      local_1730 = auVar7._0_4_;
      fStack_172c = auVar7._4_4_;
      fStack_1728 = auVar7._8_4_;
      fStack_1724 = auVar7._12_4_;
      local_1ad0 = CONCAT44((int)fStack_f9c,(int)local_fa0);
      uStack_1ac8._0_4_ = (int)fStack_f98;
      uStack_1ac8._4_4_ = (int)fStack_f94;
      auVar8._8_8_ = uStack_1ac8;
      auVar8._0_8_ = local_1ad0;
      auVar6._8_8_ = 0x7f0000007f;
      auVar6._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar8,auVar6);
      auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_1760 = auVar7._0_4_;
      fStack_175c = auVar7._4_4_;
      fStack_1758 = auVar7._8_4_;
      fStack_1754 = auVar7._12_4_;
      local_780 = CONCAT44(((((((fStack_172c * 0.00019875691 + 0.0013981999) * fStack_172c +
                               0.008333452) * fStack_172c + 0.041665796) * fStack_172c + 0.16666666)
                             * fStack_172c + 0.5) * fStack_172c * fStack_172c + fStack_172c + 1.0) *
                           fStack_175c + 1.0,
                           ((((((local_1730 * 0.00019875691 + 0.0013981999) * local_1730 +
                               0.008333452) * local_1730 + 0.041665796) * local_1730 + 0.16666666) *
                             local_1730 + 0.5) * local_1730 * local_1730 + local_1730 + 1.0) *
                           local_1760 + 1.0);
      uStack_778._0_4_ =
           ((((((fStack_1728 * 0.00019875691 + 0.0013981999) * fStack_1728 + 0.008333452) *
               fStack_1728 + 0.041665796) * fStack_1728 + 0.16666666) * fStack_1728 + 0.5) *
            fStack_1728 * fStack_1728 + fStack_1728 + 1.0) * fStack_1758 + 1.0;
      uStack_778._4_4_ =
           ((((((fStack_1724 * 0.00019875691 + 0.0013981999) * fStack_1724 + 0.008333452) *
               fStack_1724 + 0.041665796) * fStack_1724 + 0.16666666) * fStack_1724 + 0.5) *
            fStack_1724 * fStack_1724 + fStack_1724 + 1.0) * fStack_1754 + 1.0;
      auVar59._8_8_ = uStack_778;
      auVar59._0_8_ = local_780;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uStack_1a48;
      auVar7 = vcmpps_avx(auVar59,auVar65 << 0x40,2);
      auVar52._8_8_ = uStack_778;
      auVar52._0_8_ = local_780;
      auVar51._8_8_ = 0x80000000800000;
      auVar51._0_8_ = 0x80000000800000;
      auVar3 = vmaxps_avx(auVar52,auVar51);
      auVar6 = vpsrld_avx(auVar3,ZEXT416(0x17));
      auVar56._8_8_ = 0x807fffff807fffff;
      auVar56._0_8_ = 0x807fffff807fffff;
      auVar3 = vpand_avx(auVar3,auVar56);
      auVar61._8_8_ = 0x3f0000003f000000;
      auVar61._0_8_ = 0x3f0000003f000000;
      auVar8 = vpor_avx(auVar3,auVar61);
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      auVar3 = vpsubd_avx(auVar6,auVar50);
      auVar3 = vcvtdq2ps_avx(auVar3);
      local_3b0 = auVar3._0_4_;
      fStack_3ac = auVar3._4_4_;
      fStack_3a8 = auVar3._8_4_;
      fStack_3a4 = auVar3._12_4_;
      local_7c0 = CONCAT44(fStack_3ac + 1.0,local_3b0 + 1.0);
      uStack_7b8._0_4_ = fStack_3a8 + 1.0;
      uStack_7b8._4_4_ = fStack_3a4 + 1.0;
      auVar62._8_8_ = 0x3f3504f33f3504f3;
      auVar62._0_8_ = 0x3f3504f33f3504f3;
      auVar3 = vcmpps_avx(auVar8,auVar62,1);
      auVar6 = vpand_avx(auVar8,auVar3);
      auVar54._8_8_ = 0x3f8000003f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar54);
      auVar55._8_8_ = 0x3f8000003f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar3 = vpand_avx(auVar55,auVar3);
      auVar53._8_8_ = uStack_7b8;
      auVar53._0_8_ = local_7c0;
      auVar3 = vsubps_avx(auVar53,auVar3);
      local_3d0 = auVar8._0_4_;
      fStack_3cc = auVar8._4_4_;
      fStack_3c8 = auVar8._8_4_;
      fStack_3c4 = auVar8._12_4_;
      local_3e0 = auVar6._0_4_;
      fStack_3dc = auVar6._4_4_;
      fStack_3d8 = auVar6._8_4_;
      fStack_3d4 = auVar6._12_4_;
      local_3d0 = local_3d0 + local_3e0;
      fStack_3cc = fStack_3cc + fStack_3dc;
      fStack_3c8 = fStack_3c8 + fStack_3d8;
      fStack_3c4 = fStack_3c4 + fStack_3d4;
      local_290 = auVar3._0_4_;
      fStack_28c = auVar3._4_4_;
      fStack_288 = auVar3._8_4_;
      fStack_284 = auVar3._12_4_;
      local_800 = CONCAT44(fStack_28c * -0.00021219444 +
                           ((((((((fStack_3cc * 0.070376836 + -0.1151461) * fStack_3cc + 0.116769984
                                 ) * fStack_3cc + -0.12420141) * fStack_3cc + 0.14249323) *
                               fStack_3cc + -0.16668057) * fStack_3cc + 0.20000714) * fStack_3cc +
                            -0.24999994) * fStack_3cc + 0.3333333) * fStack_3cc *
                           fStack_3cc * fStack_3cc,
                           local_290 * -0.00021219444 +
                           ((((((((local_3d0 * 0.070376836 + -0.1151461) * local_3d0 + 0.116769984)
                                 * local_3d0 + -0.12420141) * local_3d0 + 0.14249323) * local_3d0 +
                              -0.16668057) * local_3d0 + 0.20000714) * local_3d0 + -0.24999994) *
                            local_3d0 + 0.3333333) * local_3d0 * local_3d0 * local_3d0);
      uStack_7f8._0_4_ =
           fStack_288 * -0.00021219444 +
           ((((((((fStack_3c8 * 0.070376836 + -0.1151461) * fStack_3c8 + 0.116769984) * fStack_3c8 +
                -0.12420141) * fStack_3c8 + 0.14249323) * fStack_3c8 + -0.16668057) * fStack_3c8 +
             0.20000714) * fStack_3c8 + -0.24999994) * fStack_3c8 + 0.3333333) * fStack_3c8 *
           fStack_3c8 * fStack_3c8;
      uStack_7f8._4_4_ =
           fStack_284 * -0.00021219444 +
           ((((((((fStack_3c4 * 0.070376836 + -0.1151461) * fStack_3c4 + 0.116769984) * fStack_3c4 +
                -0.12420141) * fStack_3c4 + 0.14249323) * fStack_3c4 + -0.16668057) * fStack_3c4 +
             0.20000714) * fStack_3c4 + -0.24999994) * fStack_3c4 + 0.3333333) * fStack_3c4 *
           fStack_3c4 * fStack_3c4;
      auVar58._8_8_ = uStack_7f8;
      auVar58._0_8_ = local_800;
      auVar57._4_4_ = fStack_3cc * fStack_3cc * 0.5;
      auVar57._0_4_ = local_3d0 * local_3d0 * 0.5;
      auVar57._8_4_ = fStack_3c8 * fStack_3c8 * 0.5;
      auVar57._12_4_ = fStack_3c4 * fStack_3c4 * 0.5;
      auVar3 = vsubps_avx(auVar58,auVar57);
      local_400 = auVar3._0_4_;
      fStack_3fc = auVar3._4_4_;
      fStack_3f8 = auVar3._8_4_;
      fStack_3f4 = auVar3._12_4_;
      local_780 = CONCAT44(fStack_28c * 0.6933594 + fStack_3cc + fStack_3fc,
                           local_290 * 0.6933594 + local_3d0 + local_400);
      uStack_778._0_4_ = fStack_288 * 0.6933594 + fStack_3c8 + fStack_3f8;
      uStack_778._4_4_ = fStack_284 * 0.6933594 + fStack_3c4 + fStack_3f4;
      auVar60._8_8_ = uStack_778;
      auVar60._0_8_ = local_780;
      auVar7 = vpor_avx(auVar60,auVar7);
      local_eb0 = auVar7._0_4_;
      fStack_eac = auVar7._4_4_;
      fStack_ea8 = auVar7._8_4_;
      fStack_ea4 = auVar7._12_4_;
      auVar43._4_4_ = fStack_eac * 2.0;
      auVar43._0_4_ = local_eb0 * 2.0;
      auVar43._12_4_ = fStack_ea4 * 2.0;
      auVar43._8_4_ = fStack_ea8 * 2.0;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uStack_1a48;
      auVar7 = vsubps_avx(auVar66 << 0x40,auVar43);
      auVar42._8_8_ = 0x42b0c0a542b0c0a5;
      auVar42._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar42);
      auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar7,auVar41);
      local_a10 = auVar6._0_4_;
      fStack_a0c = auVar6._4_4_;
      fStack_a08 = auVar6._8_4_;
      fStack_a04 = auVar6._12_4_;
      fVar74 = local_a10 * 1.442695 + 0.5;
      fVar75 = fStack_a0c * 1.442695 + 0.5;
      fVar76 = fStack_a08 * 1.442695 + 0.5;
      fVar77 = fStack_a04 * 1.442695 + 0.5;
      local_dc0 = CONCAT44(fVar75,fVar74);
      uStack_db8._0_4_ = fVar76;
      uStack_db8._4_4_ = fVar77;
      local_dd0 = CONCAT44((int)fVar75,(int)fVar74);
      uStack_dc8._0_4_ = (int)fVar76;
      uStack_dc8._4_4_ = (int)fVar77;
      auVar45._8_8_ = uStack_dc8;
      auVar45._0_8_ = local_dd0;
      auVar3 = vcvtdq2ps_avx(auVar45);
      auVar46._8_8_ = uStack_db8;
      auVar46._0_8_ = local_dc0;
      auVar7 = vcmpps_avx(auVar46,auVar3,1);
      auVar47._8_8_ = 0x3f8000003f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar7 = vpand_avx(auVar7,auVar47);
      auVar7 = vsubps_avx(auVar3,auVar7);
      local_840 = auVar7._0_4_;
      fStack_83c = auVar7._4_4_;
      fStack_838 = auVar7._8_4_;
      fStack_834 = auVar7._12_4_;
      auVar49._4_4_ = fStack_83c * 0.6933594;
      auVar49._0_4_ = local_840 * 0.6933594;
      auVar49._8_4_ = fStack_838 * 0.6933594;
      auVar49._12_4_ = fStack_834 * 0.6933594;
      auVar7 = vsubps_avx(auVar6,auVar49);
      auVar48._4_4_ = fStack_83c * -0.00021219444;
      auVar48._0_4_ = local_840 * -0.00021219444;
      auVar48._8_4_ = fStack_838 * -0.00021219444;
      auVar48._12_4_ = fStack_834 * -0.00021219444;
      auVar7 = vsubps_avx(auVar7,auVar48);
      local_a30 = auVar7._0_4_;
      fStack_a2c = auVar7._4_4_;
      fStack_a28 = auVar7._8_4_;
      fStack_a24 = auVar7._12_4_;
      local_dd0 = CONCAT44((int)fStack_83c,(int)local_840);
      uStack_dc8._0_4_ = (int)fStack_838;
      uStack_dc8._4_4_ = (int)fStack_834;
      auVar40._8_8_ = uStack_dc8;
      auVar40._0_8_ = local_dd0;
      auVar39._8_8_ = 0x7f0000007f;
      auVar39._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar40,auVar39);
      auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_a60 = auVar7._0_4_;
      fStack_a5c = auVar7._4_4_;
      fStack_a58 = auVar7._8_4_;
      fStack_a54 = auVar7._12_4_;
      auVar38._8_8_ = 0x3f8000003f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar37._4_4_ =
           (((((fStack_a2c * (fStack_a2c * 0.00019875691 + 0.0013981999) + 0.008333452) * fStack_a2c
              + 0.041665796) * fStack_a2c + 0.16666666) * fStack_a2c + 0.5) *
            fStack_a2c * fStack_a2c + fStack_a2c + 1.0) * fStack_a5c + 1.0;
      auVar37._0_4_ =
           (((((local_a30 * (local_a30 * 0.00019875691 + 0.0013981999) + 0.008333452) * local_a30 +
              0.041665796) * local_a30 + 0.16666666) * local_a30 + 0.5) * local_a30 * local_a30 +
            local_a30 + 1.0) * local_a60 + 1.0;
      auVar37._8_4_ =
           (((((fStack_a28 * (fStack_a28 * 0.00019875691 + 0.0013981999) + 0.008333452) * fStack_a28
              + 0.041665796) * fStack_a28 + 0.16666666) * fStack_a28 + 0.5) *
            fStack_a28 * fStack_a28 + fStack_a28 + 1.0) * fStack_a58 + 1.0;
      auVar37._12_4_ =
           (((((fStack_a24 * (fStack_a24 * 0.00019875691 + 0.0013981999) + 0.008333452) * fStack_a24
              + 0.041665796) * fStack_a24 + 0.16666666) * fStack_a24 + 0.5) *
            fStack_a24 * fStack_a24 + fStack_a24 + 1.0) * fStack_a54 + 1.0;
      auVar7 = vdivps_avx(auVar38,auVar37);
      local_ed0 = auVar7._0_4_;
      fStack_ecc = auVar7._4_4_;
      fStack_ec8 = auVar7._8_4_;
      fStack_ec4 = auVar7._12_4_;
      auVar78._0_4_ = local_ed0 * 2.0;
      auVar78._4_4_ = fStack_ecc * 2.0;
      auVar78._8_4_ = fStack_ec8 * 2.0;
      auVar78._12_4_ = fStack_ec4 * 2.0;
      auVar44._8_8_ = 0x3f8000003f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar78,auVar44);
      local_1c60 = auVar7._0_4_;
      fStack_1c5c = auVar7._4_4_;
      fStack_1c58 = auVar7._8_4_;
      fStack_1c54 = auVar7._12_4_;
      local_1fb0._4_4_ = fVar71 * fStack_1c5c;
      local_1fb0._0_4_ = fVar69 * local_1c60;
      uStack_1fa8._0_4_ = fVar72 * fStack_1c58;
      uStack_1fa8._4_4_ = fVar73 * fStack_1c54;
      break;
    case 6:
      fVar74 = *(float *)*in_R9;
      fVar75 = *(float *)(*in_R9 + 4);
      local_1c30 = CONCAT44(fVar71 * fVar74 + fVar75,fVar69 * fVar74 + fVar75);
      uStack_1c28._0_4_ = fVar72 * fVar74 + fVar75;
      uStack_1c28._4_4_ = fVar73 * fVar74 + fVar75;
      auVar7._8_8_ = uStack_1c28;
      auVar7._0_8_ = local_1c30;
      auVar7 = vmaxps_avx(auVar7,ZEXT816(0));
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar7 = vminps_avx(auVar7,auVar3);
      local_1ba0 = auVar7._0_4_;
      fStack_1b9c = auVar7._4_4_;
      fStack_1b98 = auVar7._8_4_;
      fStack_1b94 = auVar7._12_4_;
      local_1fb0._4_4_ = fStack_1b9c * fVar71;
      local_1fb0._0_4_ = local_1ba0 * fVar69;
      uStack_1fa8._0_4_ = fStack_1b98 * fVar72;
      uStack_1fa8._4_4_ = fStack_1b94 * fVar73;
      break;
    default:
      uStack_1fa8 = uStack_2aa8;
      local_1fb0 = (undefined1  [8])local_2ab0;
    }
    puVar68 = (undefined8 *)(*in_RSI + (long)(local_2a94 << 2) * 4);
    *puVar68 = local_1fb0;
    puVar68[1] = uStack_1fa8;
  }
  return;
}

Assistant:

static void innerproduct_fp16s_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_fp16s_pack4_sse_f16c(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
        return;
    }
#endif

#if __F16C__
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        __m128 _sum0 = _mm_setzero_ps();

        __m256 _sum01 = _mm256_setzero_ps();
        __m256 _sum23 = _mm256_setzero_ps();
        __m256 _sum45 = _mm256_setzero_ps();
        __m256 _sum67 = _mm256_setzero_ps();

        if (bias_data_ptr)
        {
            _sum0 = _mm_loadu_ps(bias_data_ptr + p * 4);
        }

        const unsigned short* kptr = weight_data_fp16.row<const unsigned short>(p);

        const float* sptr = bottom_blob;

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m128 _val0 = _mm_broadcast_ss(sptr);
            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

            __m256 _val01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val0), _val1, 1);
            __m256 _val23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val2), _val3, 1);
            __m256 _val45 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val4), _val5, 1);
            __m256 _val67 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val6), _val7, 1);

            __m256i _w0123 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256i _w4567 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));

            __m256 _w01 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 0));
            __m256 _w23 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 1));
            __m256 _w45 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w4567, 0));
            __m256 _w67 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w4567, 1));

            _sum01 = _mm256_comp_fmadd_ps(_val01, _w01, _sum01);
            _sum23 = _mm256_comp_fmadd_ps(_val23, _w23, _sum23);
            _sum45 = _mm256_comp_fmadd_ps(_val45, _w45, _sum45);
            _sum67 = _mm256_comp_fmadd_ps(_val67, _w67, _sum67);

            sptr += 8;
            kptr += 32;
        }
        for (; i + 3 < num_input; i += 4)
        {
            __m128 _val0 = _mm_set1_ps(sptr[0]);
            __m128 _val1 = _mm_set1_ps(sptr[1]);
            __m128 _val2 = _mm_set1_ps(sptr[2]);
            __m128 _val3 = _mm_set1_ps(sptr[3]);

            __m256 _val01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val0), _val1, 1);
            __m256 _val23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val2), _val3, 1);

            __m256i _w0123 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _w01 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 0));
            __m256 _w23 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 1));

            _sum01 = _mm256_comp_fmadd_ps(_val01, _w01, _sum01);
            _sum23 = _mm256_comp_fmadd_ps(_val23, _w23, _sum23);

            sptr += 4;
            kptr += 16;
        }
        for (; i < num_input; i++)
        {
            __m128 _val = _mm_set1_ps(sptr[0]);
            __m128 _w = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)kptr));
            _sum0 = _mm_comp_fmadd_ps(_val, _w, _sum0);

            sptr += 1;
            kptr += 4;
        }

        _sum01 = _mm256_add_ps(_sum01, _sum23);
        _sum45 = _mm256_add_ps(_sum45, _sum67);
        _sum01 = _mm256_add_ps(_sum01, _sum45);

        _sum0 = _mm_add_ps(_sum0, _mm256_extractf128_ps(_sum01, 0));
        _sum0 = _mm_add_ps(_sum0, _mm256_extractf128_ps(_sum01, 1));

        _sum0 = activation_sse(_sum0, activation_type, activation_params);

        float* outptr = top_blob;
        _mm_storeu_ps(outptr + p * 4, _sum0);
    }
#else  // __F16C__
    (void)bottom_blob;
    (void)top_blob;
    (void)weight_data_fp16;
    (void)bias_data;
    (void)activation_type;
    (void)activation_params;
    (void)opt;
#endif // __F16C__
}